

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O0

void __thiscall wasm::DataFlowOpts::optimizeExprToConstant(DataFlowOpts *this,Node *node)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppNVar4;
  Module *pMVar5;
  Const *pCVar6;
  pointer pFVar7;
  Name name;
  Literal local_630;
  Builder local_618;
  undefined4 local_60c;
  Expression *local_608;
  Expression *result;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8;
  allocator<char> local_5c9;
  string local_5c8;
  undefined1 local_5a8 [8];
  PassRunner runner;
  Type local_4a0;
  Type local_498;
  Signature local_490;
  HeapType local_480;
  Name local_478;
  Builder local_468;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_460;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> tempFunc;
  Module temp;
  Literal local_58;
  Builder local_40;
  Const *local_38;
  Const *c;
  Expression **currp;
  Expression *pEStack_20;
  Index i;
  Expression *expr;
  Node *node_local;
  DataFlowOpts *this_local;
  
  expr = (Expression *)node;
  node_local = (Node *)this;
  bVar1 = DataFlow::Node::isExpr(node);
  if (!bVar1) {
    __assert_fail("node->isExpr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                  ,0x75,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
  }
  bVar1 = DataFlow::Node::isConst((Node *)expr);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pEStack_20 = (Expression *)(expr->type).id;
    for (currp._4_4_ = 0; uVar2 = (ulong)currp._4_4_,
        sVar3 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                          ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            *)&expr[1].type), uVar2 < sVar3; currp._4_4_ = currp._4_4_ + 1) {
      ppNVar4 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                operator[]((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            *)&expr[1].type,(ulong)currp._4_4_);
      bVar1 = DataFlow::Node::isConst(*ppNVar4);
      if (bVar1) {
        c = (Const *)getIndexPointer(this,pEStack_20,currp._4_4_);
        ppNVar4 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                  operator[]((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                              *)&expr[1].type,(ulong)currp._4_4_);
        local_38 = Expression::dynCast<wasm::Const>(((*ppNVar4)->field_1).expr);
        pMVar5 = Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::getModule
                           (&(this->
                             super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
                             ).
                             super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                             .
                             super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                           );
        Builder::Builder(&local_40,pMVar5);
        wasm::Literal::Literal(&local_58,&local_38->value);
        pCVar6 = Builder::makeConst(&local_40,&local_58);
        *(Const **)&(c->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression =
             pCVar6;
        wasm::Literal::~Literal(&local_58);
      }
    }
    Module::Module((Module *)&tempFunc);
    Builder::Builder(&local_468,(Module *)&tempFunc);
    wasm::Name::Name(&local_478,"temp");
    wasm::Type::Type(&local_498,none);
    wasm::Type::Type(&local_4a0,none);
    Signature::Signature(&local_490,local_498,local_4a0);
    HeapType::HeapType(&local_480,local_490);
    runner.isNested = false;
    runner.addedPassesRemovedDWARF = false;
    runner._234_6_ = 0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&runner.isNested);
    name.super_IString.str._M_str = (char *)local_478.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_460;
    Builder::makeFunction
              (name,(HeapType)local_478.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_480.id,
               (Expression *)&runner.isNested);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&runner.isNested);
    PassRunner::PassRunner((PassRunner *)local_5a8,(Module *)&tempFunc);
    PassRunner::setIsNested((PassRunner *)local_5a8,true);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"precompute",&local_5c9)
    ;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_5a8,&local_5c8,&local_5f8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_5f8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator(&local_5c9);
    pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_460);
    PassRunner::runOnFunction((PassRunner *)local_5a8,pFVar7);
    pFVar7 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_460);
    local_608 = pFVar7->body;
    bVar1 = Expression::is<wasm::Const>(local_608);
    if (bVar1) {
      pMVar5 = Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>::getModule
                         (&(this->
                           super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
                           ).
                           super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                           .
                           super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                         );
      Builder::Builder(&local_618,pMVar5);
      pCVar6 = Expression::cast<wasm::Const>(local_608);
      wasm::Literal::Literal(&local_630,&pCVar6->value);
      pCVar6 = Builder::makeConst(&local_618,&local_630);
      (expr->type).id = (uintptr_t)pCVar6;
      wasm::Literal::~Literal(&local_630);
      bVar1 = DataFlow::Node::isConst((Node *)expr);
      if (!bVar1) {
        __assert_fail("node->isConst()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                      ,0x9c,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
      }
      DataFlow::Users::stopUsingValues(&this->nodeUsers,(Node *)expr);
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::clear
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                 &expr[1].type);
      replaceAllUsesWith(this,(Node *)expr,(Node *)expr);
      local_60c = 0;
    }
    else {
      local_60c = 1;
    }
    PassRunner::~PassRunner((PassRunner *)local_5a8);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_460);
    Module::~Module((Module *)&tempFunc);
    return;
  }
  __assert_fail("!node->isConst()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                ,0x76,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
}

Assistant:

void optimizeExprToConstant(DataFlow::Node* node) {
    assert(node->isExpr());
    assert(!node->isConst());
    // std::cout << "will optimize an Expr of all constant inputs. before" <<
    //              '\n';
    // dump(node, std::cout);
    auto* expr = node->expr;
    // First, note that some of the expression's children may be
    // local.gets that we inferred during SSA analysis as constant.
    // We can apply those now.
    for (Index i = 0; i < node->values.size(); i++) {
      if (node->values[i]->isConst()) {
        auto* currp = getIndexPointer(expr, i);
        // Directly represent it as a constant. (Note that it may already be
        // a constant, but for now to avoid corner cases just replace them
        // all here.)
        auto* c = node->values[i]->expr->dynCast<Const>();
        *currp = Builder(*getModule()).makeConst(c->value);
      }
    }
    // Now we know that all our DataFlow inputs are constant, and all
    // our Binaryen IR representations of them are constant too. RUn
    // precompute, which will transform the expression into a constanat.
    Module temp;
    // XXX we should copy expr here, in principle, and definitely will need to
    //     when we do arbitrarily regenerated expressions
    std::unique_ptr<Function> tempFunc(Builder(temp).makeFunction(
      "temp", Signature(Type::none, Type::none), {}, expr));
    PassRunner runner(&temp);
    runner.setIsNested(true);
    runner.add("precompute");
    runner.runOnFunction(tempFunc.get());
    // Get the optimized thing
    auto* result = tempFunc->body;
    // It may not be a constant, e.g. 0 / 0 does not optimize to 0
    if (!result->is<Const>()) {
      return;
    }
    // All good, copy it.
    node->expr = Builder(*getModule()).makeConst(result->cast<Const>()->value);
    assert(node->isConst());
    // We no longer have values, and so do not use anything.
    nodeUsers.stopUsingValues(node);
    node->values.clear();
    // Our contents changed, update our users.
    replaceAllUsesWith(node, node);
  }